

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

void build_scanners(Grammar *g)

{
  byte *pbVar1;
  undefined1 *puVar2;
  VecAction *v;
  ScanState **ppSVar3;
  uint uVar4;
  int iVar5;
  State **ppSVar6;
  State *pSVar7;
  State *pSVar8;
  Action **ppAVar9;
  Action **ppAVar10;
  Term *pTVar11;
  ScanState *pSVar12;
  ScanState **ppSVar13;
  ScanState *pSVar14;
  ScanStateTransition **ppSVar15;
  Rule *pRVar16;
  char *pcVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  LexState *ls;
  NFAState *pNVar22;
  ushort **ppuVar23;
  __int32_t **pp_Var24;
  Action *trailing;
  NFAState *pNVar25;
  NFAState *pNVar26;
  DFAState *pDVar27;
  void *pvVar28;
  ScanStateTransition *t;
  ScanStateTransition *pSVar29;
  long lVar30;
  anon_struct_40_4_d8687ec6 *paVar31;
  ulong uVar32;
  ulong uVar33;
  NFAState **ppNVar34;
  NFAState **ppNVar35;
  Action *pAVar36;
  VecAction *pVVar37;
  byte bVar38;
  Scanner *pSVar39;
  ulong uVar40;
  Scanner *pSVar41;
  anon_struct_40_4_d8687ec6_for_accepts *paVar42;
  uint *puVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  byte *pbVar49;
  long lVar50;
  NFAState **ppNVar51;
  bool bVar52;
  byte bVar53;
  ulong local_98;
  undefined8 *puStack_90;
  undefined8 local_88 [4];
  Grammar *local_68;
  anon_struct_40_4_d8687ec6_for_actions *local_60;
  anon_struct_40_4_d8687ec6 *local_58;
  Action **local_50;
  ulong local_48;
  NFAState **local_40;
  uint8 *local_38;
  
  bVar53 = 0;
  ls = (LexState *)malloc(0x40);
  *(undefined8 *)ls = 0;
  (ls->allnfas).n = 0;
  (ls->allnfas).i = 0;
  (ls->allnfas).v = (NFAState **)0x0;
  (ls->allnfas).e[0] = (NFAState *)0x0;
  (ls->allnfas).e[1] = (NFAState *)0x0;
  (ls->allnfas).e[2] = (NFAState *)0x0;
  ls->transitions = 0;
  ls->scanners = 0;
  *(undefined8 *)&ls->ignore_case = 0;
  uVar32 = (ulong)(g->states).n;
  if (uVar32 != 0) {
    ppSVar6 = (g->states).v;
    uVar33 = 0;
    do {
      pSVar7 = ppSVar6[uVar33];
      if (uVar33 != 0 && pSVar7->same_shifts == (State *)0x0) {
        uVar40 = 0;
        do {
          pSVar8 = ppSVar6[uVar40];
          if (((pSVar8->same_shifts == (State *)0x0) &&
              (uVar46 = (pSVar8->shift_actions).n, uVar46 == (pSVar7->shift_actions).n)) &&
             (((pSVar7->field_0x178 ^ pSVar8->field_0x178) & 0x38) == 0)) {
            bVar52 = uVar46 != 0;
            if (bVar52) {
              ppAVar9 = (pSVar7->shift_actions).v;
              ppAVar10 = (pSVar8->shift_actions).v;
              if ((*ppAVar9)->term == (*ppAVar10)->term) {
                lVar50 = 0;
                do {
                  if (uVar46 - 1 == (int)lVar50) goto LAB_0013fb67;
                  lVar30 = lVar50 + 1;
                  lVar18 = lVar50 + 1;
                  lVar50 = lVar50 + 1;
                } while (ppAVar9[lVar30]->term == ppAVar10[lVar18]->term);
                bVar52 = (uint)lVar50 < uVar46;
              }
              if (bVar52) goto LAB_0013fb59;
            }
LAB_0013fb67:
            pSVar7->same_shifts = pSVar8;
            break;
          }
LAB_0013fb59:
          uVar40 = uVar40 + 1;
        } while (uVar40 != uVar33);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar32);
  }
  local_68 = g;
  if ((g->states).n != 0) {
    local_60 = &g->actions;
    local_50 = (g->actions).e;
    local_40 = (ls->allnfas).e;
    uVar32 = 0;
    do {
      pSVar7 = (g->states).v[uVar32];
      if ((pSVar7->shift_actions).n != 0) {
        local_48 = uVar32;
        if (pSVar7->same_shifts == (State *)0x0) {
          pNVar22 = new_NFAState(ls);
          if ((pSVar7->shift_actions).n == 0) {
            bVar52 = false;
          }
          else {
            local_58 = pNVar22->chars;
            ppNVar51 = pNVar22->chars[0].e;
            uVar32 = 0;
            bVar52 = false;
            do {
              pAVar36 = (pSVar7->shift_actions).v[uVar32];
              if (pAVar36->kind == ACTION_SHIFT) {
                pTVar11 = pAVar36->term;
                if (pTVar11->kind == TERM_STRING) {
                  pbVar49 = (byte *)pTVar11->string;
                  bVar38 = *pbVar49;
                  pNVar25 = pNVar22;
                  if ((pTVar11->field_0x2c & 8) == 0) {
                    while (bVar38 != 0) {
                      ppNVar35 = pNVar25->chars[bVar38].v;
                      if (pNVar25->chars[bVar38].n == 0) {
                        if (ppNVar35 == (NFAState **)0x0) {
                          pNVar26 = new_NFAState(ls);
                          bVar38 = *pbVar49;
                          ppNVar35 = pNVar25->chars[bVar38].e;
                          ppNVar35[-1] = (NFAState *)ppNVar35;
                          uVar46 = pNVar25->chars[*pbVar49].n;
                          pNVar25->chars[*pbVar49].n = uVar46 + 1;
                          pNVar25->chars[bVar38].e[uVar46] = pNVar26;
                        }
                        else {
                          pNVar26 = new_NFAState(ls);
                          if (ppNVar35 == pNVar25->chars[bVar38].e) {
                            bVar38 = *pbVar49;
                            ppNVar35 = pNVar25->chars[bVar38].v;
                            uVar46 = pNVar25->chars[bVar38].n;
                            pNVar25->chars[bVar38].n = uVar46 + 1;
                            ppNVar35[uVar46] = pNVar26;
                          }
                          else {
                            vec_add_internal(pNVar25->chars + bVar38,pNVar26);
                          }
                        }
                      }
                      else {
                        pNVar26 = *ppNVar35;
                      }
                      pbVar1 = pbVar49 + 1;
                      pbVar49 = pbVar49 + 1;
                      pNVar25 = pNVar26;
                      bVar38 = *pbVar1;
                    }
                  }
                  else if (bVar38 != 0) {
                    ppuVar23 = __ctype_b_loc();
                    pNVar26 = pNVar22;
                    do {
                      uVar33 = (ulong)bVar38;
                      if ((*(byte *)((long)*ppuVar23 + uVar33 * 2 + 1) & 4) == 0) {
                        ppNVar35 = pNVar26->chars[uVar33].v;
                        if (ppNVar35 == (NFAState **)0x0) {
                          pNVar25 = new_NFAState(ls);
                          bVar38 = *pbVar49;
                          ppNVar35 = pNVar26->chars[bVar38].e;
                          ppNVar35[-1] = (NFAState *)ppNVar35;
                          uVar46 = pNVar26->chars[*pbVar49].n;
                          pNVar26->chars[*pbVar49].n = uVar46 + 1;
                          pNVar26->chars[bVar38].e[uVar46] = pNVar25;
                        }
                        else {
                          paVar31 = pNVar26->chars + uVar33;
                          if (ppNVar35 == paVar31->e) {
                            if (2 < paVar31->n) goto LAB_0013ffbe;
                          }
                          else if ((paVar31->n & 7) == 0) {
LAB_0013ffbe:
                            pNVar25 = new_NFAState(ls);
                            vec_add_internal(paVar31,pNVar25);
                            goto LAB_0014007b;
                          }
                          pNVar25 = new_NFAState(ls);
                          bVar38 = *pbVar49;
                          ppNVar35 = pNVar26->chars[bVar38].v;
                          uVar46 = pNVar26->chars[bVar38].n;
                          pNVar26->chars[bVar38].n = uVar46 + 1;
                          ppNVar35[uVar46] = pNVar25;
                        }
                      }
                      else {
                        pp_Var24 = __ctype_toupper_loc();
                        ppNVar35 = pNVar26->chars[(*pp_Var24)[uVar33]].v;
                        if (ppNVar35 == (NFAState **)0x0) {
                          pNVar25 = new_NFAState(ls);
                          iVar21 = (*pp_Var24)[*pbVar49];
                          ppNVar35 = pNVar26->chars[iVar21].e;
                          ppNVar35[-1] = (NFAState *)ppNVar35;
                          uVar46 = pNVar26->chars[(*pp_Var24)[*pbVar49]].n;
                          pNVar26->chars[(*pp_Var24)[*pbVar49]].n = uVar46 + 1;
                          pNVar26->chars[iVar21].e[uVar46] = pNVar25;
                        }
                        else {
                          paVar31 = pNVar26->chars + (*pp_Var24)[uVar33];
                          if (ppNVar35 == paVar31->e) {
                            if (2 < paVar31->n) goto LAB_0013ffe8;
                          }
                          else if ((paVar31->n & 7) == 0) {
LAB_0013ffe8:
                            pNVar25 = new_NFAState(ls);
                            vec_add_internal(paVar31,pNVar25);
                            goto LAB_0013fffb;
                          }
                          pNVar25 = new_NFAState(ls);
                          iVar21 = (*pp_Var24)[*pbVar49];
                          ppNVar35 = pNVar26->chars[iVar21].v;
                          uVar46 = pNVar26->chars[iVar21].n;
                          pNVar26->chars[iVar21].n = uVar46 + 1;
                          ppNVar35[uVar46] = pNVar25;
                        }
LAB_0013fffb:
                        pp_Var24 = __ctype_tolower_loc();
                        paVar31 = pNVar26->chars + (*pp_Var24)[*pbVar49];
                        ppNVar35 = paVar31->v;
                        ppNVar34 = pNVar26->chars[(*pp_Var24)[*pbVar49]].e;
                        if (ppNVar35 == (NFAState **)0x0) {
                          paVar31->v = ppNVar34;
                          uVar46 = pNVar26->chars[(*pp_Var24)[*pbVar49]].n;
                          pNVar26->chars[(*pp_Var24)[*pbVar49]].n = uVar46 + 1;
                          paVar31->e[uVar46] = pNVar25;
                        }
                        else {
                          uVar46 = paVar31->n;
                          if (ppNVar35 == ppNVar34) {
                            if (2 < uVar46) goto LAB_00140073;
                          }
                          else if ((uVar46 & 7) == 0) {
LAB_00140073:
                            vec_add_internal(paVar31,pNVar25);
                            goto LAB_0014007b;
                          }
                          paVar31->n = uVar46 + 1;
                          ppNVar35[uVar46] = pNVar25;
                        }
                      }
LAB_0014007b:
                      bVar38 = pbVar49[1];
                      pbVar49 = pbVar49 + 1;
                      pNVar26 = pNVar25;
                    } while (bVar38 != 0);
                  }
                  ppAVar10 = (pNVar25->accepts).v;
                  ppAVar9 = (pNVar25->accepts).e;
                  if (ppAVar10 != (Action **)0x0) {
                    paVar42 = &pNVar25->accepts;
                    uVar46 = paVar42->n;
                    if (ppAVar10 == ppAVar9) {
                      if (uVar46 < 3) goto LAB_0014014e;
                    }
                    else if ((uVar46 & 7) != 0) {
LAB_0014014e:
                      paVar42->n = uVar46 + 1;
                      ppAVar10[uVar46] = pAVar36;
                      goto LAB_00140168;
                    }
                    goto LAB_00140163;
                  }
                  (pNVar25->accepts).v = ppAVar9;
                  uVar46 = (pNVar25->accepts).n;
                  (pNVar25->accepts).n = uVar46 + 1;
                  (pNVar25->accepts).e[uVar46] = pAVar36;
                  bVar52 = true;
                }
              }
              else if (pAVar36->kind == ACTION_ACCEPT) {
                ppNVar35 = pNVar22->chars[0].v;
                if (pNVar22->chars[0].n == 0) {
                  if (ppNVar35 == (NFAState **)0x0) {
                    pNVar25 = new_NFAState(ls);
                    pNVar22->chars[0].v = ppNVar51;
                    uVar46 = pNVar22->chars[0].n;
                    pNVar22->chars[0].n = uVar46 + 1;
                    pNVar22->chars[0].e[uVar46] = pNVar25;
                  }
                  else {
                    pNVar25 = new_NFAState(ls);
                    if (ppNVar35 == ppNVar51) {
                      uVar46 = pNVar22->chars[0].n;
                      pNVar22->chars[0].n = uVar46 + 1;
                      pNVar22->chars[0].v[uVar46] = pNVar25;
                    }
                    else {
                      vec_add_internal(local_58,pNVar25);
                    }
                  }
                }
                else {
                  pNVar25 = *ppNVar35;
                }
                ppAVar10 = (pNVar25->accepts).v;
                ppAVar9 = (pNVar25->accepts).e;
                if (ppAVar10 == (Action **)0x0) {
                  (pNVar25->accepts).v = ppAVar9;
                  uVar46 = (pNVar25->accepts).n;
                  (pNVar25->accepts).n = uVar46 + 1;
                  (pNVar25->accepts).e[uVar46] = pAVar36;
                }
                else {
                  paVar42 = &pNVar25->accepts;
                  uVar46 = paVar42->n;
                  if (ppAVar10 == ppAVar9) {
                    if (2 < uVar46) goto LAB_00140163;
                  }
                  else if ((uVar46 & 7) == 0) {
LAB_00140163:
                    vec_add_internal(paVar42,pAVar36);
                    goto LAB_00140168;
                  }
                  paVar42->n = uVar46 + 1;
                  ppAVar10[uVar46] = pAVar36;
                }
LAB_00140168:
                bVar52 = true;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (pSVar7->shift_actions).n);
          }
          if ((pSVar7->shift_actions).n != 0) {
            ppNVar51 = (pNVar22->epsilon).e;
            uVar32 = 0;
            do {
              pAVar36 = (pSVar7->shift_actions).v[uVar32];
              if ((pAVar36->kind == ACTION_SHIFT) && (pAVar36->term->kind == TERM_REGEX)) {
                trailing = (Action *)malloc(0x30);
                uVar19 = *(undefined4 *)&pAVar36->field_0x4;
                pTVar11 = pAVar36->term;
                pRVar16 = pAVar36->rule;
                pSVar8 = pAVar36->state;
                uVar4 = pAVar36->index;
                uVar20 = *(undefined4 *)&pAVar36->field_0x24;
                pcVar17 = pAVar36->temp_string;
                trailing->kind = pAVar36->kind;
                *(undefined4 *)&trailing->field_0x4 = uVar19;
                trailing->term = pTVar11;
                trailing->rule = pRVar16;
                trailing->state = pSVar8;
                trailing->index = uVar4;
                *(undefined4 *)&trailing->field_0x24 = uVar20;
                trailing->temp_string = pcVar17;
                trailing->kind = ACTION_SHIFT_TRAILING;
                uVar4 = local_68->action_count;
                local_68->action_count = uVar4 + 1;
                trailing->index = uVar4;
                local_38 = (uint8 *)pAVar36->term->string;
                ppNVar35 = (pNVar22->epsilon).v;
                if (ppNVar35 == (NFAState **)0x0) {
                  pNVar25 = new_NFAState(ls);
                  (pNVar22->epsilon).v = ppNVar51;
                  uVar46 = (pNVar22->epsilon).n;
                  (pNVar22->epsilon).n = uVar46 + 1;
                  (pNVar22->epsilon).e[uVar46] = pNVar25;
                }
                else {
                  uVar46 = (pNVar22->epsilon).n;
                  if (ppNVar35 == ppNVar51) {
                    if (2 < uVar46) goto LAB_001402bd;
                  }
                  else if ((uVar46 & 7) == 0) {
LAB_001402bd:
                    pNVar25 = new_NFAState(ls);
                    vec_add_internal(&pNVar22->epsilon,pNVar25);
                    goto LAB_001402da;
                  }
                  pNVar25 = new_NFAState(ls);
                  uVar46 = (pNVar22->epsilon).n;
                  (pNVar22->epsilon).n = uVar46 + 1;
                  (pNVar22->epsilon).v[uVar46] = pNVar25;
                }
LAB_001402da:
                pNVar26 = new_NFAState(ls);
                ls->ignore_case = *(uint *)&pAVar36->term->field_0x2c >> 3 & 1;
                iVar21 = build_regex_nfa(ls,&local_38,pNVar25,pNVar26,trailing);
                if (iVar21 == 0) {
                  free(trailing);
                }
                else {
                  puVar2 = &pAVar36->term->field_0x2c;
                  *puVar2 = *puVar2 | 0x10;
                  pSVar7->field_0x178 = pSVar7->field_0x178 | 0x40;
                  ppAVar9 = (local_68->actions).v;
                  if (ppAVar9 == (Action **)0x0) {
                    (local_68->actions).v = local_50;
                    uVar46 = (local_68->actions).n;
                    (local_68->actions).n = uVar46 + 1;
                    (local_68->actions).e[uVar46] = trailing;
                  }
                  else {
                    uVar46 = local_60->n;
                    if (ppAVar9 == local_50) {
                      if (2 < uVar46) goto LAB_0014039d;
                    }
                    else if ((uVar46 & 7) == 0) {
LAB_0014039d:
                      vec_add_internal(local_60,trailing);
                      goto LAB_001403aa;
                    }
                    local_60->n = uVar46 + 1;
                    ppAVar9[uVar46] = trailing;
                  }
                }
LAB_001403aa:
                ppAVar10 = (pNVar26->accepts).v;
                ppAVar9 = (pNVar26->accepts).e;
                if (ppAVar10 == (Action **)0x0) {
                  (pNVar26->accepts).v = ppAVar9;
                  uVar46 = (pNVar26->accepts).n;
                  (pNVar26->accepts).n = uVar46 + 1;
                  (pNVar26->accepts).e[uVar46] = pAVar36;
                }
                else {
                  paVar42 = &pNVar26->accepts;
                  uVar46 = paVar42->n;
                  if (ppAVar10 == ppAVar9) {
                    if (2 < uVar46) goto LAB_0014040c;
                  }
                  else if ((uVar46 & 7) == 0) {
LAB_0014040c:
                    vec_add_internal(paVar42,pAVar36);
                    goto LAB_00140417;
                  }
                  paVar42->n = uVar46 + 1;
                  ppAVar10[uVar46] = pAVar36;
                }
LAB_00140417:
                bVar52 = true;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (pSVar7->shift_actions).n);
          }
          if (bVar52) {
            pDVar27 = (DFAState *)malloc(0x830);
            memset(pDVar27,0,0x830);
            local_88[0] = 0;
            local_88[1] = 0;
            local_98 = 0;
            puStack_90 = (undefined8 *)0x0;
            local_88[2] = 0;
            ppNVar51 = (pDVar27->states).v;
            ppNVar35 = (pDVar27->states).e;
            if (ppNVar51 == (NFAState **)0x0) {
              (pDVar27->states).v = ppNVar35;
              uVar46 = (pDVar27->states).n;
              (pDVar27->states).n = uVar46 + 1;
              (pDVar27->states).e[uVar46] = pNVar22;
            }
            else {
              uVar46 = (pDVar27->states).n;
              if (ppNVar51 == ppNVar35) {
                if (2 < uVar46) goto LAB_001404bf;
              }
              else if ((uVar46 & 7) == 0) {
LAB_001404bf:
                vec_add_internal(pDVar27,pNVar22);
                goto LAB_001404ca;
              }
              (pDVar27->states).n = uVar46 + 1;
              ppNVar51[uVar46] = pNVar22;
            }
LAB_001404ca:
            nfa_closure(pDVar27);
            if (puStack_90 == (undefined8 *)0x0) {
              puStack_90 = local_88;
              uVar32 = local_98 & 0xffffffff;
              local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
              local_88[uVar32] = pDVar27;
            }
            else {
              uVar32 = local_98 & 0xffffffff;
              if (puStack_90 == local_88) {
                if (2 < (uint)local_98) goto LAB_00140523;
              }
              else if ((local_98 & 7) == 0) {
LAB_00140523:
                vec_add_internal(&local_98,pDVar27);
                goto LAB_00140530;
              }
              local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
              puStack_90[uVar32] = pDVar27;
            }
LAB_00140530:
            if ((uint)local_98 == 0) {
              bVar52 = true;
            }
            else {
              uVar32 = 0;
              do {
                puVar43 = (uint *)puStack_90[uVar32];
                lVar50 = 0;
                do {
                  if (*puVar43 == 0) {
                    pDVar27 = (DFAState *)0x0;
                  }
                  else {
                    uVar33 = 0;
                    pDVar27 = (DFAState *)0x0;
                    do {
                      if (*(int *)(*(long *)(*(long *)(puVar43 + 2) + uVar33 * 8) + 8 +
                                  lVar50 * 0x28) != 0) {
                        uVar40 = 0;
                        do {
                          if (pDVar27 == (DFAState *)0x0) {
                            pDVar27 = (DFAState *)malloc(0x830);
                            memset(pDVar27,0,0x830);
                          }
                          set_add(pDVar27,*(void **)(*(long *)(*(long *)(*(long *)(puVar43 + 2) +
                                                                        uVar33 * 8) + 0x10 +
                                                              lVar50 * 0x28) + uVar40 * 8));
                          uVar40 = uVar40 + 1;
                        } while (uVar40 < *(uint *)(*(long *)(*(long *)(puVar43 + 2) + uVar33 * 8) +
                                                    8 + lVar50 * 0x28));
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar33 < *puVar43);
                  }
                  if (pDVar27 != (DFAState *)0x0) {
                    set_to_vec(pDVar27);
                    nfa_closure(pDVar27);
                    uVar33 = local_98 & 0xffffffff;
                    if (uVar33 != 0) {
                      uVar46 = (pDVar27->states).n;
                      uVar40 = 0;
                      do {
                        if (uVar46 == *(uint *)puStack_90[uVar40]) {
                          if ((ulong)uVar46 == 0) {
LAB_00140659:
                            free_DFAState(pDVar27);
                            pDVar27 = (DFAState *)puStack_90[uVar40];
                            goto LAB_001406a4;
                          }
                          uVar44 = 0;
                          while ((pDVar27->states).v[uVar44] ==
                                 *(NFAState **)
                                  (*(long *)((uint *)puStack_90[uVar40] + 2) + uVar44 * 8)) {
                            uVar44 = uVar44 + 1;
                            if (uVar46 == uVar44) goto LAB_00140659;
                          }
                        }
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != uVar33);
                    }
                    if (puStack_90 == (undefined8 *)0x0) {
                      puStack_90 = local_88;
                      local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
                      local_88[uVar33] = pDVar27;
                    }
                    else {
                      if (puStack_90 == local_88) {
                        if (2 < (uint)local_98) goto LAB_00140697;
                      }
                      else if ((local_98 & 7) == 0) {
LAB_00140697:
                        vec_add_internal(&local_98,pDVar27);
                        goto LAB_001406a4;
                      }
                      local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
                      puStack_90[uVar33] = pDVar27;
                    }
LAB_001406a4:
                    *(DFAState **)(puVar43 + lVar50 * 2 + 10) = pDVar27;
                  }
                  lVar50 = lVar50 + 1;
                } while (lVar50 != 0x100);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (local_98 & 0xffffffff));
              bVar52 = (uint)local_98 == 0;
            }
            pSVar39 = &pSVar7->scanner;
            (pSVar7->scanner).states.n = 0;
            (pSVar7->scanner).states.v = (ScanState **)0x0;
            if (!bVar52) {
              ppSVar3 = (pSVar7->scanner).states.e;
              uVar32 = 0;
              do {
                pvVar28 = malloc(0x1058);
                memset(pvVar28,0,0x1058);
                *(void **)(puStack_90[uVar32] + 0x828) = pvVar28;
                pSVar12 = *(ScanState **)(puStack_90[uVar32] + 0x828);
                pSVar12->index = (uint)uVar32;
                ppSVar13 = (pSVar7->scanner).states.v;
                if (ppSVar13 == (ScanState **)0x0) {
                  (pSVar7->scanner).states.v = ppSVar3;
                  uVar46 = (pSVar7->scanner).states.n;
                  (pSVar7->scanner).states.n = uVar46 + 1;
                  (pSVar7->scanner).states.e[uVar46] = pSVar12;
                }
                else {
                  uVar46 = (pSVar39->states).n;
                  if (ppSVar13 == ppSVar3) {
                    if (2 < uVar46) goto LAB_001407af;
                  }
                  else if ((uVar46 & 7) == 0) {
LAB_001407af:
                    vec_add_internal(pSVar39,pSVar12);
                    goto LAB_001407b9;
                  }
                  (pSVar39->states).n = uVar46 + 1;
                  ppSVar13[uVar46] = pSVar12;
                }
LAB_001407b9:
                uVar32 = uVar32 + 1;
              } while (uVar32 < (local_98 & 0xffffffff));
            }
            if ((uint)local_98 != 0) {
              uVar32 = 0;
              do {
                lVar50 = 0;
                do {
                  lVar30 = *(long *)(puStack_90[uVar32] + 0x28 + lVar50 * 8);
                  if (lVar30 != 0) {
                    *(undefined8 *)(*(long *)(puStack_90[uVar32] + 0x828) + 8 + lVar50 * 8) =
                         *(undefined8 *)(lVar30 + 0x828);
                  }
                  lVar50 = lVar50 + 1;
                } while (lVar50 != 0x100);
                uVar33 = (ulong)*(uint *)puStack_90[uVar32];
                if (uVar33 == 0) {
                  iVar21 = -0x80000000;
                }
                else {
                  iVar21 = -0x80000000;
                  uVar40 = 0;
                  do {
                    lVar50 = *(long *)(*(long *)((uint *)puStack_90[uVar32] + 2) + uVar40 * 8);
                    uVar44 = (ulong)*(uint *)(lVar50 + 0x2830);
                    if (uVar44 != 0) {
                      uVar45 = 0;
                      do {
                        iVar5 = *(int *)(*(long *)(*(long *)(*(long *)(lVar50 + 0x2838) + uVar45 * 8
                                                            ) + 8) + 8);
                        if (iVar21 <= iVar5) {
                          iVar21 = iVar5;
                        }
                        uVar45 = uVar45 + 1;
                      } while (uVar44 != uVar45);
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar33);
                }
                if (uVar33 != 0) {
                  uVar33 = 0;
                  do {
                    lVar50 = puStack_90[uVar32];
                    lVar30 = *(long *)(*(long *)(lVar50 + 8) + uVar33 * 8);
                    if (*(int *)(lVar30 + 0x2830) != 0) {
                      uVar40 = 0;
                      do {
                        pvVar28 = *(void **)(*(long *)(lVar30 + 0x2838) + uVar40 * 8);
                        if (*(int *)(*(long *)((long)pvVar28 + 8) + 8) == iVar21) {
                          lVar50 = *(long *)(lVar50 + 0x828);
                          lVar30 = *(long *)(lVar50 + 0x810);
                          if (lVar30 == 0) {
                            *(long *)(lVar50 + 0x810) = lVar50 + 0x818;
                            uVar46 = *(uint *)(*(long *)(puStack_90[uVar32] + 0x828) + 0x808);
                            *(uint *)(*(long *)(puStack_90[uVar32] + 0x828) + 0x808) = uVar46 + 1;
                            *(void **)(lVar50 + 0x818 + (ulong)uVar46 * 8) = pvVar28;
                          }
                          else {
                            puVar43 = (uint *)(lVar50 + 0x808);
                            uVar46 = *puVar43;
                            if (lVar30 == lVar50 + 0x818) {
                              if (2 < uVar46) goto LAB_0014091e;
                            }
                            else if ((uVar46 & 7) == 0) {
LAB_0014091e:
                              vec_add_internal(puVar43,pvVar28);
                              goto LAB_00140923;
                            }
                            *puVar43 = uVar46 + 1;
                            *(void **)(lVar30 + (ulong)uVar46 * 8) = pvVar28;
                          }
                        }
LAB_00140923:
                        uVar40 = uVar40 + 1;
                        lVar50 = puStack_90[uVar32];
                        lVar30 = *(long *)(*(long *)(lVar50 + 8) + uVar33 * 8);
                      } while (uVar40 < *(uint *)(lVar30 + 0x2830));
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < *(uint *)puStack_90[uVar32]);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 < (local_98 & 0xffffffff));
            }
            if ((uint)local_98 != 0) {
              uVar32 = 0;
              do {
                free_DFAState((DFAState *)puStack_90[uVar32]);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (local_98 & 0xffffffff));
            }
            if (puStack_90 != local_88 && puStack_90 != (undefined8 *)0x0) {
              free(puStack_90);
            }
            if ((pSVar39->states).n != 0) {
              uVar32 = 0;
              do {
                pSVar12 = (pSVar7->scanner).states.v[uVar32];
                set_union(&pSVar12->live,&pSVar12->accepts);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (pSVar7->scanner).states.n);
            }
            do {
              if ((pSVar39->states).n == 0) break;
              uVar32 = 0;
              bVar52 = false;
              do {
                pSVar12 = (pSVar7->scanner).states.v[uVar32];
                lVar50 = 1;
                do {
                  pSVar14 = pSVar12->chars[lVar50 + -1];
                  if ((pSVar12 != pSVar14 && pSVar14 != (ScanState *)0x0) &&
                     (iVar21 = set_union(&pSVar12->live,&pSVar14->live), iVar21 != 0)) {
                    bVar52 = true;
                  }
                  lVar50 = lVar50 + 1;
                } while (lVar50 != 0x101);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (pSVar39->states).n);
            } while (bVar52);
            if ((pSVar39->states).n != 0) {
              uVar32 = 0;
              do {
                pVVar37 = &(pSVar7->scanner).states.v[uVar32]->live;
                set_to_vec(pVVar37);
                sort_VecAction(pVVar37);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (pSVar7->scanner).states.n);
            }
            trans_hash_fns.data[0] = (void *)0x1;
            if ((pSVar39->states).n != 0) {
              paVar31 = (anon_struct_40_4_d8687ec6 *)0x0;
              t = (ScanStateTransition *)0x0;
LAB_00140ad2:
              pSVar12 = (pSVar7->scanner).states.v[(long)paVar31];
              lVar50 = 0;
              local_58 = paVar31;
LAB_00140ae5:
              if (t == (ScanStateTransition *)0x0) {
                t = (ScanStateTransition *)malloc(0x58);
                *(undefined8 *)t = 0;
                (t->live_diff).n = 0;
                (t->live_diff).i = 0;
                (t->live_diff).v = (Action **)0x0;
                (t->live_diff).e[0] = (Action *)0x0;
                (t->live_diff).e[1] = (Action *)0x0;
                (t->live_diff).e[2] = (Action *)0x0;
                (t->accepts_diff).n = 0;
                (t->accepts_diff).i = 0;
                (t->accepts_diff).v = (Action **)0x0;
                (t->accepts_diff).e[0] = (Action *)0x0;
                (t->accepts_diff).e[1] = (Action *)0x0;
                (t->accepts_diff).e[2] = (Action *)0x0;
              }
              pSVar14 = pSVar12->chars[lVar50];
              if (pSVar14 != (ScanState *)0x0) {
                pVVar37 = &t->live_diff;
                if ((pSVar12->live).n != 0) {
                  ppAVar9 = (t->live_diff).e;
                  uVar46 = 0;
                  uVar32 = 0;
                  while (uVar46 < (pSVar14->live).n) {
                    uVar33 = (ulong)uVar46;
                    while( true ) {
                      pAVar36 = (pSVar12->live).v[uVar32];
                      uVar46 = (pSVar14->live).v[uVar33]->index;
                      if (pAVar36->index == uVar46) break;
                      if (pAVar36->index < uVar46) {
                        ppAVar10 = (t->live_diff).v;
                        if (ppAVar10 == (Action **)0x0) {
                          (t->live_diff).v = ppAVar9;
                          uVar46 = (t->live_diff).n;
                          (t->live_diff).n = uVar46 + 1;
                          (t->live_diff).e[uVar46] = pAVar36;
                        }
                        else {
                          uVar46 = pVVar37->n;
                          if (ppAVar10 == ppAVar9) {
                            if (2 < uVar46) goto LAB_00140bba;
                          }
                          else if ((uVar46 & 7) == 0) {
LAB_00140bba:
                            vec_add_internal(pVVar37,pAVar36);
                            goto LAB_00140bc4;
                          }
                          pVVar37->n = uVar46 + 1;
                          ppAVar10[uVar46] = pAVar36;
                        }
LAB_00140bc4:
                        uVar46 = (int)uVar32 + 1;
                        uVar32 = (ulong)uVar46;
                        if ((pSVar12->live).n <= uVar46) goto LAB_00140c9a;
                      }
                      else {
                        uVar33 = uVar33 + 1;
                        if ((pSVar14->live).n <= uVar33) goto LAB_00140c00;
                      }
                    }
                    uVar48 = (int)uVar32 + 1;
                    uVar32 = (ulong)uVar48;
                    uVar46 = (int)uVar33 + 1;
                    if ((pSVar12->live).n <= uVar48) goto LAB_00140c9a;
                  }
LAB_00140c00:
                  if ((uint)uVar32 < (pSVar12->live).n) goto LAB_00140c10;
                }
                goto LAB_00140c9a;
              }
              goto LAB_00140d5f;
            }
            t = (ScanStateTransition *)0x0;
LAB_00140e2d:
            if (t != (ScanStateTransition *)0x0) {
              free(t);
            }
            set_to_vec(&(pSVar7->scanner).transitions);
            uVar46 = (pSVar7->scanner).transitions.n;
            if ((ulong)uVar46 != 0) {
              ppSVar15 = (pSVar7->scanner).transitions.v;
              uVar32 = 0;
              do {
                ppSVar15[uVar32]->index = (uint)uVar32;
                uVar32 = uVar32 + 1;
              } while (uVar46 != uVar32);
            }
            ls->transitions = ls->transitions + uVar46;
          }
          if ((ls->allnfas).n != 0) {
            uVar32 = 0;
            do {
              pNVar22 = (ls->allnfas).v[uVar32];
              ppNVar51 = pNVar22->chars[0].e;
              lVar50 = 0x100;
              do {
                ppNVar35 = (NFAState **)ppNVar51[-1];
                if (ppNVar51 != ppNVar35 && ppNVar35 != (NFAState **)0x0) {
                  free(ppNVar35);
                }
                ((anon_struct_40_4_d8687ec6 *)(ppNVar51 + -2))->n = 0;
                ppNVar51[-1] = (NFAState *)0x0;
                ppNVar51 = ppNVar51 + 5;
                lVar50 = lVar50 + -1;
              } while (lVar50 != 0);
              ppNVar51 = (pNVar22->epsilon).v;
              if (ppNVar51 != (pNVar22->epsilon).e && ppNVar51 != (NFAState **)0x0) {
                free(ppNVar51);
              }
              (pNVar22->epsilon).n = 0;
              (pNVar22->epsilon).v = (NFAState **)0x0;
              ppAVar9 = (pNVar22->accepts).v;
              if (ppAVar9 != (pNVar22->accepts).e && ppAVar9 != (Action **)0x0) {
                free(ppAVar9);
              }
              (pNVar22->accepts).n = 0;
              (pNVar22->accepts).v = (Action **)0x0;
              free(pNVar22);
              uVar32 = uVar32 + 1;
            } while (uVar32 < (ls->allnfas).n);
          }
          ppNVar51 = (ls->allnfas).v;
          if (ppNVar51 != local_40 && ppNVar51 != (NFAState **)0x0) {
            free(ppNVar51);
          }
          (ls->allnfas).n = 0;
          (ls->allnfas).v = (NFAState **)0x0;
          ls->scanners = ls->scanners + 1;
          uVar32 = local_48;
          g = local_68;
        }
        else {
          pSVar39 = &pSVar7->same_shifts->scanner;
          pSVar41 = &pSVar7->scanner;
          for (lVar50 = 10; lVar50 != 0; lVar50 = lVar50 + -1) {
            uVar4 = (pSVar39->states).i;
            (pSVar41->states).n = (pSVar39->states).n;
            (pSVar41->states).i = uVar4;
            pSVar39 = (Scanner *)((long)pSVar39 + (ulong)bVar53 * -0x10 + 8);
            pSVar41 = (Scanner *)((long)pSVar41 + (ulong)bVar53 * -0x10 + 8);
          }
        }
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < (g->states).n);
  }
  if (d_verbose_level != 0) {
    printf("%d scanners %d transitions\n",(ulong)ls->scanners,(ulong)ls->transitions);
  }
  free(ls);
  return;
LAB_00140c10:
  do {
    ppAVar10 = (t->live_diff).v;
    if (ppAVar10 == (Action **)0x0) {
      pAVar36 = (pSVar12->live).v[uVar32];
      (t->live_diff).v = ppAVar9;
      uVar46 = (t->live_diff).n;
      (t->live_diff).n = uVar46 + 1;
      (t->live_diff).e[uVar46] = pAVar36;
    }
    else {
      uVar46 = pVVar37->n;
      if (ppAVar10 == ppAVar9) {
        if (2 < uVar46) goto LAB_00140c72;
        pAVar36 = (pSVar12->live).v[uVar32];
      }
      else {
        if ((uVar46 & 7) == 0) {
LAB_00140c72:
          vec_add_internal(pVVar37,(pSVar12->live).v[uVar32]);
          goto LAB_00140c87;
        }
        pAVar36 = (pSVar12->live).v[uVar32];
      }
      pVVar37->n = uVar46 + 1;
      ppAVar10[uVar46] = pAVar36;
    }
LAB_00140c87:
    uVar32 = uVar32 + 1;
  } while (uVar32 < (pSVar12->live).n);
LAB_00140c9a:
  uVar46 = (pSVar12->accepts).n;
  if (uVar46 != 0) {
    v = &t->accepts_diff;
    ppAVar9 = (t->accepts_diff).e;
    uVar32 = 0;
    uVar33 = 0;
LAB_00140cb6:
    if ((uint)uVar32 < pVVar37->n) {
LAB_00140ccd:
      uVar48 = (t->live_diff).v[uVar32]->index;
      do {
        pAVar36 = (pSVar12->accepts).v[uVar33];
        if (pAVar36->index == uVar48) {
          ppAVar10 = (t->accepts_diff).v;
          if (ppAVar10 == (Action **)0x0) {
            (t->accepts_diff).v = ppAVar9;
            uVar46 = (t->accepts_diff).n;
            (t->accepts_diff).n = uVar46 + 1;
            (t->accepts_diff).e[uVar46] = pAVar36;
          }
          else {
            uVar46 = v->n;
            if (ppAVar10 == ppAVar9) {
              if (2 < uVar46) goto LAB_00140d3d;
            }
            else if ((uVar46 & 7) == 0) {
LAB_00140d3d:
              vec_add_internal(v,pAVar36);
              goto LAB_00140d4a;
            }
            v->n = uVar46 + 1;
            ppAVar10[uVar46] = pAVar36;
          }
LAB_00140d4a:
          uVar48 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar48;
          uVar32 = (ulong)((int)uVar32 + 1);
          uVar46 = (pSVar12->accepts).n;
          if (uVar48 < uVar46) goto LAB_00140cb6;
          break;
        }
        if (uVar48 <= pAVar36->index) goto LAB_00140cee;
        uVar47 = (int)uVar33 + 1;
        uVar33 = (ulong)uVar47;
        if (uVar46 <= uVar47) break;
      } while( true );
    }
  }
LAB_00140d5f:
  pSVar29 = (ScanStateTransition *)set_add_fn(&(pSVar7->scanner).transitions,t,&trans_hash_fns);
  if (pSVar29 == t) {
    t = (ScanStateTransition *)0x0;
  }
  else {
    ppAVar9 = (t->live_diff).v;
    if (ppAVar9 != (t->live_diff).e && ppAVar9 != (Action **)0x0) {
      free(ppAVar9);
    }
    (t->live_diff).n = 0;
    (t->live_diff).v = (Action **)0x0;
    ppAVar9 = (t->accepts_diff).v;
    if (ppAVar9 != (t->accepts_diff).e && ppAVar9 != (Action **)0x0) {
      free(ppAVar9);
    }
    (t->accepts_diff).n = 0;
    (t->accepts_diff).v = (Action **)0x0;
  }
  pSVar12->transition[lVar50] = pSVar29;
  lVar50 = lVar50 + 1;
  if (lVar50 == 0x100) goto code_r0x00140e08;
  goto LAB_00140ae5;
LAB_00140cee:
  uVar32 = uVar32 + 1;
  if (uVar32 == pVVar37->n) goto LAB_00140d5f;
  goto LAB_00140ccd;
code_r0x00140e08:
  paVar31 = (anon_struct_40_4_d8687ec6 *)((long)&local_58->n + 1);
  if ((undefined1 *)(ulong)(pSVar39->states).n <= paVar31) goto LAB_00140e2d;
  goto LAB_00140ad2;
}

Assistant:

void build_scanners(Grammar *g) {
  uint i, j, k;
  State *s;
  LexState *ls = new_LexState();

  /* detect identical scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->same_shifts) continue;
    for (j = 0; j < i; j++) {
      if (g->states.v[j]->same_shifts) continue;
      if (g->states.v[j]->shift_actions.n != s->shift_actions.n) continue;
      if (g->states.v[j]->scan_kind != s->scan_kind) continue;
      for (k = 0; k < g->states.v[j]->shift_actions.n; k++)
        if (s->shift_actions.v[k]->term != g->states.v[j]->shift_actions.v[k]->term) break;
      if (k >= g->states.v[j]->shift_actions.n) {
        s->same_shifts = g->states.v[j];
        break;
      }
    }
  }
  /* build scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->shift_actions.n) {
      if (s->same_shifts)
        s->scanner = s->same_shifts->scanner;
      else
        build_state_scanner(g, ls, s);
    }
  }
  if (d_verbose_level) printf("%d scanners %d transitions\n", ls->scanners, ls->transitions);
  FREE(ls);
}